

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_file.c
# Opt level: O0

ssize_t file_read(archive *a,void *client_data,void **buff)

{
  ssize_t sVar1;
  int *piVar2;
  uint *puVar3;
  undefined8 *in_RDX;
  int *in_RSI;
  archive *in_RDI;
  ssize_t bytes_read;
  read_file_data *mine;
  
  *in_RDX = *(undefined8 *)(in_RSI + 4);
  do {
    sVar1 = read(*in_RSI,*(void **)(in_RSI + 4),*(size_t *)(in_RSI + 2));
    if (-1 < sVar1) {
      return sVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (in_RSI[8] == 0) {
    puVar3 = (uint *)__errno_location();
    archive_set_error(in_RDI,(int)(ulong)*puVar3,"Error reading stdin");
  }
  else if (in_RSI[8] == 1) {
    puVar3 = (uint *)__errno_location();
    archive_set_error(in_RDI,(int)(ulong)*puVar3,"Error reading \'%s\'",in_RSI + 9);
  }
  else {
    puVar3 = (uint *)__errno_location();
    archive_set_error(in_RDI,(int)(ulong)*puVar3,"Error reading \'%S\'",in_RSI + 9);
  }
  return sVar1;
}

Assistant:

static ssize_t
file_read(struct archive *a, void *client_data, const void **buff)
{
	struct read_FILE_data *mine = (struct read_FILE_data *)client_data;
	size_t bytes_read;

	*buff = mine->buffer;
	bytes_read = fread(mine->buffer, 1, mine->block_size, mine->f);
	if (bytes_read < mine->block_size && ferror(mine->f)) {
		archive_set_error(a, errno, "Error reading file");
	}
	return (bytes_read);
}